

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norm2allmodes.h
# Opt level: O2

int32_t __thiscall
icu_63::Normalizer2WithImpl::spanQuickCheckYes
          (Normalizer2WithImpl *this,UnicodeString *s,UErrorCode *errorCode)

{
  short sVar1;
  int iVar2;
  char16_t *pcVar3;
  undefined4 extraout_var;
  int32_t iVar4;
  
  iVar4 = 0;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    pcVar3 = UnicodeString::getBuffer(s);
    if (pcVar3 == (char16_t *)0x0) {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      sVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar2 = (s->fUnion).fFields.fLength;
      }
      else {
        iVar2 = (int)sVar1 >> 5;
      }
      iVar2 = (*(this->super_Normalizer2).super_UObject._vptr_UObject[0x14])
                        (this,pcVar3,pcVar3 + iVar2,errorCode);
      iVar4 = (int32_t)((ulong)(CONCAT44(extraout_var,iVar2) - (long)pcVar3) >> 1);
    }
  }
  return iVar4;
}

Assistant:

virtual int32_t
    spanQuickCheckYes(const UnicodeString &s, UErrorCode &errorCode) const {
        if(U_FAILURE(errorCode)) {
            return 0;
        }
        const UChar *sArray=s.getBuffer();
        if(sArray==NULL) {
            errorCode=U_ILLEGAL_ARGUMENT_ERROR;
            return 0;
        }
        return (int32_t)(spanQuickCheckYes(sArray, sArray+s.length(), errorCode)-sArray);
    }